

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator::next
          (FastGeneralizationsIterator *this)

{
  TypedTermList t;
  bool bVar1;
  byte *in_RSI;
  SortId in_RDI;
  SmartPtr<Indexing::ResultSubstitution> *unifier;
  FastGeneralizationsIterator *in_stack_00000008;
  Rhs *ld;
  Renaming *in_stack_ffffffffffffff70;
  Rhs *data;
  SmartPtr<Indexing::ResultSubstitution> *in_stack_ffffffffffffff78;
  Renaming *in_stack_ffffffffffffff80;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
  *this_00;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar2;
  GenMatcher *this_01;
  Rhs local_58;
  undefined1 local_38 [32];
  Rhs *local_18;
  
  this_01 = (GenMatcher *)in_RDI._content;
  do {
    bVar1 = Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::hasNext
                      ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)0x3ce86f);
    uVar2 = false;
    if (!bVar1) {
      uVar2 = findNextLeaf(in_stack_00000008);
    }
  } while ((bool)uVar2 != false);
  local_18 = Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::next
                       ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)0x3ce8a4);
  if ((*in_RSI & 1) == 0) {
    data = &local_58;
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)data);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>::
    QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,data);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)data);
  }
  else {
    unifier = (SmartPtr<Indexing::ResultSubstitution> *)(in_RSI + 0x70);
    Kernel::Renaming::reset(in_stack_ffffffffffffff70);
    local_38._16_16_ = (undefined1  [16])Inferences::ALASCA::Demodulation::Rhs::key(local_18);
    t.super_TermList._content._7_1_ = uVar2;
    t.super_TermList._content._0_7_ = in_stack_ffffffffffffff88;
    t._sort._content = in_RDI._content;
    Kernel::Renaming::normalizeVariables(in_stack_ffffffffffffff80,t);
    this_00 = (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
               *)local_38;
    SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::getSubstitution
              (this_01,(Renaming *)in_RDI._content);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>::
    QueryRes(this_00,unifier,(Rhs *)in_stack_ffffffffffffff70);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_ffffffffffffff70);
  }
  return (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
          *)this_01;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastGeneralizationsIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultNormalizer.reset();
    _resultNormalizer.normalizeVariables(ld->key());

    return QueryRes(_subst.getSubstitution(&_resultNormalizer),ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}